

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-object.c
# Opt level: O0

void pdf_dict_del(hd_context *ctx,pdf_obj *obj,pdf_obj *key)

{
  char *pcVar1;
  pdf_obj *key_local;
  pdf_obj *obj_local;
  hd_context *ctx_local;
  
  if (key < (pdf_obj *)0x189) {
    if ((key != (pdf_obj *)0x0) && (key < (pdf_obj *)0x186)) goto LAB_0012acab;
  }
  else if (key->kind == 'n') {
LAB_0012acab:
    if (key < (pdf_obj *)0x186) {
      pdf_dict_dels(ctx,obj,PDF_NAMES[(long)key]);
    }
    else {
      pdf_dict_dels(ctx,obj,(char *)(key + 1));
    }
    return;
  }
  pcVar1 = pdf_objkindstr(key);
  hd_throw(ctx,2,"key is not a name (%s)",pcVar1);
}

Assistant:

void
pdf_dict_del(hd_context *ctx, pdf_obj *obj, pdf_obj *key)
{
    if (!OBJ_IS_NAME(key))
        hd_throw(ctx, HD_ERROR_GENERIC, "key is not a name (%s)", pdf_objkindstr(key));

    if (key < PDF_OBJ_NAME__LIMIT)
        pdf_dict_dels(ctx, obj, PDF_NAMES[(intptr_t)key]);
    else
        pdf_dict_dels(ctx, obj, NAME(key)->n);
}